

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WriteHash
          (WrapperFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Descriptor *pDVar2;
  char *text;
  FieldDescriptor *local_28;
  _func_void_FieldDescriptor_ptr *local_20;
  
  pDVar2 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  pFVar1 = *(FieldDescriptor **)(pDVar2 + 0x28);
  if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
    local_20 = FieldDescriptor::TypeOnceInit;
    local_28 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x30),&local_20,&local_28);
  }
  if (*(int *)(pFVar1 + 0x38) == 2) {
    text = 
    "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.GetHashCode($property_name$);\n"
    ;
  }
  else {
    pDVar2 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
    pFVar1 = *(FieldDescriptor **)(pDVar2 + 0x28);
    if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
      local_20 = FieldDescriptor::TypeOnceInit;
      local_28 = pFVar1;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar1 + 0x30),&local_20,&local_28);
    }
    text = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
    if (*(int *)(pFVar1 + 0x38) == 1) {
      text = 
      "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.GetHashCode($property_name$);\n"
      ;
    }
  }
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void WrapperFieldGenerator::WriteHash(io::Printer* printer) {
  const char *text = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
  if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.GetHashCode($property_name$);\n";
  }
  else if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.GetHashCode($property_name$);\n";
  }
  printer->Print(variables_, text);
}